

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QSize __thiscall QDockAreaLayoutInfo::sizeHint(QDockAreaLayoutInfo *this)

{
  uint uVar1;
  Orientation OVar2;
  Representation RVar3;
  QDockAreaLayoutItem *pQVar4;
  QSize QVar5;
  bool bVar6;
  Representation RVar7;
  QSize QVar8;
  QSize QVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  Representation RVar13;
  ulong uVar14;
  long lVar15;
  QDockAreaLayoutItem *this_00;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  QDockAreaLayoutItem *this_01;
  uint local_6c;
  uint local_64;
  
  uVar18 = 0xffffffffffffffff;
  uVar14 = 0;
  lVar15 = 0;
  do {
    uVar18 = uVar18 + 1;
    if ((ulong)(this->item_list).d.size <= uVar18) {
      uVar18 = 0;
      goto LAB_003edf21;
    }
    bVar6 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&((this->item_list).d.ptr)->widgetItem + lVar15));
    lVar15 = lVar15 + 0x28;
  } while (bVar6);
  if ((this->item_list).d.size == 0) {
    uVar17 = 0;
    uVar12 = 0xffffff;
    local_64 = 0;
    local_6c = 0;
  }
  else {
    uVar12 = 0xffffff;
    lVar15 = 0;
    uVar14 = 0;
    this_00 = (QDockAreaLayoutItem *)0x0;
    local_6c = 0;
    local_64 = 0;
    uVar17 = 0;
    do {
      pQVar4 = (this->item_list).d.ptr;
      this_01 = (QDockAreaLayoutItem *)((long)&pQVar4->widgetItem + lVar15);
      bVar6 = QDockAreaLayoutItem::skip(this_01);
      RVar13.m_i = local_64;
      if (!bVar6) {
        uVar1 = *(uint *)((long)&pQVar4->flags + lVar15);
        QVar8 = QDockAreaLayoutItem::sizeHint(this_01);
        RVar13 = QVar8.ht.m_i;
        OVar2 = this->o;
        QVar9 = QDockAreaLayoutItem::minimumSize(this_01);
        QVar5 = (QSize)((ulong)QVar9 >> 0x20);
        if (OVar2 == Vertical) {
          QVar5 = QVar9;
        }
        RVar3.m_i = QVar5.wd.m_i.m_i;
        if (QVar5.wd.m_i.m_i < (int)uVar17) {
          RVar3.m_i = uVar17;
        }
        uVar17 = RVar3.m_i;
        OVar2 = this->o;
        QVar9 = QDockAreaLayoutItem::maximumSize(this_01);
        QVar5 = (QSize)((ulong)QVar9 >> 0x20);
        if (OVar2 == Vertical) {
          QVar5 = QVar9;
        }
        RVar3.m_i = QVar5.wd.m_i.m_i;
        if ((int)uVar12 < QVar5.wd.m_i.m_i) {
          RVar3.m_i = uVar12;
        }
        uVar12 = RVar3.m_i;
        RVar3 = QVar8.wd.m_i;
        if (this->tabbed == true) {
          if ((uVar1 & 1) == 0) {
            RVar7.m_i = RVar13.m_i;
            if (this->o == Horizontal) {
              RVar7.m_i = RVar3.m_i;
            }
          }
          else {
            RVar7.m_i = *(uint *)((long)&pQVar4->size + lVar15);
          }
          if (RVar7.m_i < (int)local_6c) {
            RVar7.m_i = local_6c;
          }
        }
        else {
          if ((this_00 == (QDockAreaLayoutItem *)0x0) || ((uVar1 & 1) != 0)) {
            if ((uVar1 & 1) == 0) goto LAB_003ede29;
            RVar7.m_i = *(uint *)((long)&pQVar4->size + lVar15);
          }
          else {
            if ((this_00->flags & 1) == 0) {
              OVar2 = this->o;
              QVar8 = QDockAreaLayoutItem::minimumSize(this_00);
              QVar9 = QDockAreaLayoutItem::maximumSize(this_00);
              bVar6 = OVar2 == Vertical;
              QVar5 = (QSize)((ulong)QVar8 >> 0x20);
              if (bVar6) {
                QVar5 = QVar8;
              }
              RVar7 = QVar9.ht.m_i;
              if (bVar6) {
                RVar7 = QVar9.wd.m_i;
              }
              if (QVar5.wd.m_i.m_i != RVar7.m_i) {
                local_6c = local_6c + *this->sep;
              }
            }
LAB_003ede29:
            RVar7.m_i = RVar13.m_i;
            if (this->o == Horizontal) {
              RVar7.m_i = RVar3.m_i;
            }
          }
          RVar7.m_i = local_6c + RVar7.m_i;
        }
        local_6c = RVar7.m_i;
        if (this->o == Vertical) {
          RVar13.m_i = RVar3.m_i;
        }
        this_00 = this_01;
        if (RVar13.m_i < (int)local_64) {
          RVar13.m_i = local_64;
        }
      }
      local_64 = RVar13.m_i;
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x28;
    } while (uVar14 < (ulong)(this->item_list).d.size);
  }
  if ((int)uVar12 <= (int)uVar17) {
    uVar12 = uVar17;
  }
  if ((int)uVar17 < (int)local_64) {
    uVar17 = local_64;
  }
  if ((int)uVar12 <= (int)uVar17) {
    uVar17 = uVar12;
  }
  uVar18 = (ulong)uVar17;
  uVar16 = uVar18;
  if (this->o == Horizontal) {
    uVar18 = (ulong)local_6c;
  }
  else if (this->o == Vertical) {
    uVar16 = (ulong)local_6c;
  }
  else {
    uVar18 = 0xffffffff;
  }
  uVar14 = uVar16;
  if (this->tabbed != false) {
    bVar6 = updateTabBar(this);
    if (bVar6) {
      uVar10 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x70))();
    }
    else {
      uVar10 = 0;
    }
    if ((uint)this->tabBarShape < 8) {
      iVar11 = (int)(uVar10 >> 0x20);
      if ((0x33U >> (this->tabBarShape & 0x1fU) & 1) == 0) {
        uVar14 = uVar10 >> 0x20;
        if (iVar11 < (int)uVar16) {
          uVar14 = uVar16;
        }
        uVar18 = (ulong)(uint)((int)uVar18 + (int)uVar10);
      }
      else {
        uVar14 = (ulong)(uint)((int)uVar16 + iVar11);
        if ((int)uVar18 <= (int)uVar10) {
          uVar18 = uVar10 & 0xffffffff;
        }
      }
    }
  }
LAB_003edf21:
  return (QSize)(uVar18 | uVar14 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::sizeHint() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    int min_perp = 0;
    int max_perp = QWIDGETSIZE_MAX;
    const QDockAreaLayoutItem *previous = nullptr;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        bool gap = item.flags & QDockAreaLayoutItem::GapItem;

        QSize size_hint = item.sizeHint();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));
        max_perp = qMin(max_perp, perp(o, item.maximumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, gap ? item.size : pick(o, size_hint));
        } else
#endif
        {
            if (previous && !gap && !(previous->flags &  QDockAreaLayoutItem::GapItem)
                && !previous->hasFixedSize(o)) {
                a += *sep;
            }
            a += gap ? item.size : pick(o, size_hint);
        }
        b = qMax(b, perp(o, size_hint));

        previous = &item;
    }

    max_perp = qMax(max_perp, min_perp);
    b = qMax(b, min_perp);
    b = qMin(b, max_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        QSize tbh = tabBarSizeHint();
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbh.height();
                result.rwidth() = qMax(tbh.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbh.height(), result.height());
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}